

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

Expression __thiscall
dynet::SimpleRNNBuilder::set_h_impl
          (SimpleRNNBuilder *this,int prev,
          vector<dynet::Expression,_std::allocator<dynet::Expression>_> *h_new)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pvVar5;
  pointer pvVar6;
  undefined8 uVar7;
  long lVar8;
  ostream *poVar9;
  invalid_argument *this_00;
  ulong uVar10;
  ulong uVar11;
  ostringstream oss;
  allocator_type aaStack_1c8 [32];
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_1a8 [15];
  
  pEVar3 = (h_new->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (h_new->super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pEVar3 != pEVar4) && ((long)pEVar4 - (long)pEVar3 >> 4 != (ulong)this->layers)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Number of inputs passed to RNNBuilder::set_h() (",0x30);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,") is not equal to the number of layers (",0x28);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,(string *)aaStack_1c8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar5 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = (this->h).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (local_1a8,(ulong)this->layers,aaStack_1c8);
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)&this->h,local_1a8);
  if (local_1a8[0].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8[0].
                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  uVar11 = ((long)pvVar5 - (long)pvVar6 >> 3) * -0x5555555555555555;
  if (this->layers != 0) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&((h_new->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data._M_start)->pg + lVar8);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)
               (*(long *)&(this->h).
                          super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11 & 0xffffffff].
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar10 < this->layers);
  }
  return (*(pointer *)
           ((long)&(this->h).
                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11 & 0xffffffff].
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
           + 8))[-1];
}

Assistant:

Expression SimpleRNNBuilder::set_h_impl(int prev, const vector<Expression>& h_new) {
  DYNET_ARG_CHECK(h_new.empty() || h_new.size() == layers,
                          "Number of inputs passed to RNNBuilder::set_h() (" << h_new.size() << ") is not equal to the number of layers (" << layers << ")");
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));
  for (unsigned i = 0; i < layers; ++i) {
    Expression y = h_new[i];
    h[t][i] = y;
  }
  return h[t].back();
}